

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::NeuralNetworkRegressor::MergePartialFromCodedStream
          (NeuralNetworkRegressor *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  Type *this_00;
  Type *this_01;
  NetworkUpdateParameters *this_02;
  pair<int,_int> pVar7;
  char cVar8;
  ulong uVar9;
  
LAB_0023557f:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002355a2;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002355a2:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_002355ff_caseD_3;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\n') break;
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (&(this->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar7 < 0) {
        return false;
      }
      bVar4 = NeuralNetworkLayer::MergePartialFromCodedStream(this_00,input);
LAB_0023579e:
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar7.first);
      goto LAB_002355e3;
    case 2:
      if (cVar8 == '\x12') {
        this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                            (&(this->preprocessing_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = NeuralNetworkPreprocessing::MergePartialFromCodedStream(this_01,input);
        goto LAB_0023579e;
      }
      break;
    case 5:
      if (cVar8 == '(') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar9 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002357b3;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_002357b3:
          uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar9 < 0) {
            return false;
          }
        }
        this->arrayinputshapemapping_ = (int)uVar9;
        goto LAB_0023557f;
      }
      break;
    case 6:
      if (cVar8 == '0') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar9 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002357cd;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_002357cd:
          uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar9 < 0) {
            return false;
          }
        }
        this->imageinputshapemapping_ = (int)uVar9;
        goto LAB_0023557f;
      }
      break;
    case 10:
      if (cVar8 == 'R') {
        this_02 = this->updateparams_;
        if (this_02 == (NetworkUpdateParameters *)0x0) {
          this_02 = (NetworkUpdateParameters *)operator_new(0x50);
          NetworkUpdateParameters::NetworkUpdateParameters(this_02);
          this->updateparams_ = this_02;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = NetworkUpdateParameters::MergePartialFromCodedStream(this_02,input);
        goto LAB_0023579e;
      }
    }
switchD_002355ff_caseD_3:
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_002355e3:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NeuralNetworkRegressor::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NeuralNetworkRegressor)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_preprocessing()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_arrayinputshapemapping(static_cast< ::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_imageinputshapemapping(static_cast< ::CoreML::Specification::NeuralNetworkImageShapeMapping >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updateparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NeuralNetworkRegressor)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NeuralNetworkRegressor)
  return false;
#undef DO_
}